

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

void PostProcess(Mat *frame,vector<cv::Mat,_std::allocator<cv::Mat>_> *outs,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *classes,double *confThreshold,double *nmsThreshold)

{
  ulong uVar1;
  float *pfVar2;
  const_reference pvVar3;
  _InputArray *p_Var4;
  size_type sVar5;
  reference pvVar6;
  reference r;
  const_reference className;
  reference conf;
  int local_1e4;
  int local_1e0;
  undefined1 local_1dc [8];
  Rect box;
  int idx;
  size_t i_1;
  vector<int,_std::allocator<int>_> indices;
  float local_194;
  int local_190;
  int local_18c;
  int top;
  int left;
  int height;
  int width;
  int centerY;
  int centerX;
  double local_160;
  double confidence;
  Point classIdPoint;
  Mat local_f0 [8];
  Mat scores;
  int local_8c;
  float *pfStack_88;
  int j;
  float *data;
  size_t i;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boxes;
  vector<float,_std::allocator<float>_> confidences;
  vector<int,_std::allocator<int>_> classIds;
  double *nmsThreshold_local;
  double *confThreshold_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *classes_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *outs_local;
  Mat *frame_local;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&i);
  data = (float *)0x0;
  while( true ) {
    pfVar2 = (float *)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(outs);
    if (pfVar2 <= data) break;
    pvVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](outs,(size_type)data);
    pfStack_88 = *(float **)(pvVar3 + 0x10);
    local_8c = 0;
    while( true ) {
      pvVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](outs,(size_type)data);
      if (*(int *)(pvVar3 + 8) <= local_8c) break;
      pvVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](outs,(size_type)data);
      cv::Mat::row((Mat *)&classIdPoint,(int)pvVar3);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](outs,(size_type)data);
      cv::Mat::colRange(local_f0,(int)&classIdPoint,5);
      cv::Mat::~Mat((Mat *)&classIdPoint);
      cv::Point_<int>::Point_((Point_<int> *)&confidence);
      cv::_InputArray::_InputArray((_InputArray *)&centerY,local_f0);
      p_Var4 = (_InputArray *)cv::noArray();
      cv::minMaxLoc((_InputArray *)&centerY,(double *)0x0,&local_160,(Point_ *)0x0,
                    (Point_ *)&confidence,p_Var4);
      cv::_InputArray::~_InputArray((_InputArray *)&centerY);
      if (*confThreshold <= local_160 && local_160 != *confThreshold) {
        width = (int)(*pfStack_88 * (float)*(int *)(frame + 0xc));
        height = (int)(pfStack_88[1] * (float)*(int *)(frame + 8));
        left = (int)(pfStack_88[2] * (float)*(int *)(frame + 0xc));
        top = (int)(pfStack_88[3] * (float)*(int *)(frame + 8));
        local_18c = width - left / 2;
        local_190 = height - top / 2;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type_conflict1 *)&confidence);
        local_194 = (float)local_160;
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_194);
        cv::Rect_<int>::Rect_
                  ((Rect_<int> *)
                   ((long)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4),local_18c,local_190,left,
                   top);
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::push_back
                  ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&i,
                   (value_type *)
                   ((long)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
      }
      cv::Mat::~Mat(local_f0);
      local_8c = local_8c + 1;
      pvVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](outs,(size_type)data);
      pfStack_88 = pfStack_88 + *(int *)(pvVar3 + 0xc);
    }
    data = (float *)((long)data + 1);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_1);
  cv::dnn::dnn4_v20211004::NMSBoxes
            ((vector *)&i,
             (vector *)
             &boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(float)*confThreshold,(float)*nmsThreshold,
             (vector *)&i_1,1.0,0);
  stack0xfffffffffffffe38 = 0;
  while( true ) {
    uVar1 = stack0xfffffffffffffe38;
    sVar5 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i_1);
    if (sVar5 <= uVar1) break;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i_1,stack0xfffffffffffffe38);
    box.width = *pvVar6;
    r = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&i,(long)box.width);
    cv::Rect_<int>::Rect_((Rect_<int> *)local_1dc,r);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)box.width);
    className = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](classes,(long)*pvVar6);
    conf = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)
                      &boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(long)box.width);
    local_1e0 = local_1dc._0_4_ + box.x;
    local_1e4 = local_1dc._4_4_ + box.y;
    DrawPred(className,conf,(int *)local_1dc,(int *)(local_1dc + 4),&local_1e0,&local_1e4,frame);
    register0x00000000 = stack0xfffffffffffffe38 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_1);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&i);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void PostProcess(cv::Mat& frame, std::vector<cv::Mat> const& outs, std::vector<std::string> const& classes,
    double const& confThreshold, double const& nmsThreshold) noexcept {
  std::vector<int> classIds;
  std::vector<float> confidences;
  std::vector<cv::Rect> boxes;
  
  for (size_t i = 0; i < outs.size(); ++i) {
    /** Scan through all the bounding boxes output from the network and keep only the
     * ones with high confidence scores. Assign the box's class label as the class
     * with the highest score for the box.*/
    float* data = (float*)outs[i].data;
    for (int j = 0; j < outs[i].rows; ++j, data += outs[i].cols) {
      cv::Mat scores = outs[i].row(j).colRange(5, outs[i].cols);
      cv::Point classIdPoint;
      double confidence;
      //! Get the value and location of the maximum score
      cv::minMaxLoc(scores, 0, &confidence, 0, &classIdPoint);
      if (confidence > confThreshold) {
        int centerX = (int)(data[0] * frame.cols);
        int centerY = (int)(data[1] * frame.rows);
        int width = (int)(data[2] * frame.cols);
        int height = (int)(data[3] * frame.rows);
        int left = centerX - width / 2;
        int top = centerY - height / 2;
      
        classIds.push_back(classIdPoint.x);
        confidences.push_back((float)confidence);
        boxes.push_back(cv::Rect(left, top, width, height));
      }
    }
  }
  
  /** Perform non maximum suppression to eliminate redundant overlapping boxes with
   * lower confidences */
  std::vector<int> indices;
  cv::dnn::NMSBoxes(boxes, confidences, confThreshold, nmsThreshold, indices);
  for (size_t i = 0; i < indices.size(); ++i) {
    int idx = indices[i];
    cv::Rect box = boxes[idx];
    DrawPred(classes[classIds[idx]], confidences[idx], box.x, box.y,
        box.x + box.width, box.y + box.height, frame);
  }
}